

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

int Lodtalk::executeScriptFromFileNamed(InterpreterProxy *interpreter,string *filename)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  undefined1 local_50 [8];
  string basePathString;
  StdFile local_20;
  StdFile file;
  string *filename_local;
  InterpreterProxy *interpreter_local;
  
  file.file = (FILE *)filename;
  StdFile::StdFile(&local_20,filename,"r");
  pFVar2 = StdFile::operator_cast_to__IO_FILE_(&local_20);
  if (pFVar2 == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    nativeErrorFormat("Failed to open file \'%s\'",uVar3);
  }
  dirname((Lodtalk *)local_50,(char *)file.file);
  pFVar2 = StdFile::operator_cast_to__IO_FILE_(&local_20);
  iVar1 = executeScriptFromFile(interpreter,pFVar2,(string *)file.file,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  StdFile::~StdFile(&local_20);
  return iVar1;
}

Assistant:

int executeScriptFromFileNamed(InterpreterProxy *interpreter, const std::string &filename)
{
	StdFile file(filename, "r");
	if(!file)
		nativeErrorFormat("Failed to open file '%s'", filename.c_str());

	std::string basePathString = dirname(filename);

	return executeScriptFromFile(interpreter, file, filename, basePathString);
}